

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O3

void mserialize::detail::BuiltinSerializer<std::unique_ptr<int,_std::default_delete<int>_>,_void>::
     serialize<OutputStream>(unique_ptr<int,_std::default_delete<int>_> *opt,OutputStream *ostream)

{
  stringstream *psVar1;
  undefined8 in_RAX;
  long lVar2;
  undefined8 uStack_18;
  
  if ((opt->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl == (int *)0x0) {
    lVar2 = (long)&uStack_18 + 3;
    uStack_18._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
    uStack_18._0_3_ = (uint3)in_RAX;
    uStack_18._0_4_ = (uint)(uint3)uStack_18;
    psVar1 = ostream->stream;
  }
  else {
    uStack_18._3_5_ = (undefined5)((ulong)in_RAX >> 0x18);
    uStack_18._0_3_ = CONCAT12(1,(short)in_RAX);
    std::ostream::write((char *)(ostream->stream + 0x10),(long)&uStack_18 + 2);
    lVar2 = (long)&uStack_18 + 4;
    uStack_18 = CONCAT44(*(opt->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl,(uint)uStack_18);
    psVar1 = ostream->stream;
  }
  std::ostream::write((char *)(psVar1 + 0x10),lVar2);
  return;
}

Assistant:

static void serialize(const Optional& opt, OutputStream& ostream)
  {
    if (opt)
    {
      mserialize::serialize(std::uint8_t{1}, ostream);
      mserialize::serialize(*opt, ostream);
    }
    else
    {
      mserialize::serialize(std::uint8_t{0}, ostream);
    }
  }